

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polycurve.cpp
# Opt level: O1

bool __thiscall ON_PolyCurve::Extend(ON_PolyCurve *this,ON_Interval *domain)

{
  uint segment_index;
  char cVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  ON_Curve *pOVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  double dVar7;
  double extraout_XMM0_Qa_00;
  double in_XMM1_Qa;
  ON_Interval sdom;
  ON_Interval DesiredDom;
  ON_Interval cdom;
  ON_Interval local_70;
  ON_Interval local_60;
  ON_Interval local_50;
  ON_Interval local_40;
  
  iVar3 = (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x34])();
  if (((char)iVar3 == '\0') && (0 < (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count)) {
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_70.m_t[1] = in_XMM1_Qa;
    local_70.m_t[0] = extraout_XMM0_Qa;
    cVar1 = '\0';
    pdVar4 = ON_Interval::operator[](&local_70,0);
    dVar7 = *pdVar4;
    dVar6 = ON_Interval::operator[](domain,0);
    if (dVar6 < dVar7) {
      if ((this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count < 1) {
        pOVar5 = (ON_Curve *)0x0;
      }
      else {
        pOVar5 = *(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a;
      }
      if (pOVar5 == (ON_Curve *)0x0) {
        cVar1 = '\0';
      }
      else {
        local_70 = SegmentDomain(this,0);
        dVar7 = local_70.m_t[1];
        (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
        local_40.m_t[1] = dVar7;
        dVar7 = ON_Interval::operator[](domain,0);
        dVar6 = ON_Interval::TransformParameterTo(&local_70,&local_40,dVar7);
        pdVar4 = ON_Interval::operator[](&local_40,1);
        dVar7 = *pdVar4;
        ON_Interval::ON_Interval(&local_50,dVar6,dVar7);
        iVar3 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])
                          (pOVar5,&local_50);
        cVar1 = (char)iVar3;
        if (cVar1 != '\0') {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
          local_60.m_t[1] = dVar7;
          bVar2 = ON_Interval::operator==(&local_60,&local_50);
          if (bVar2) {
            dVar6 = ON_Interval::operator[](domain,0);
          }
          else {
            (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
            local_60.m_t[1] = dVar7;
            pdVar4 = ON_Interval::operator[](&local_60,0);
            dVar6 = ON_Interval::TransformParameterTo(&local_40,&local_70,*pdVar4);
          }
          *(this->m_t).m_a = dVar6;
        }
      }
      if (pOVar5 == (ON_Curve *)0x0) goto LAB_005958e0;
    }
    (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])(this);
    local_70.m_t[1] = dVar7;
    local_70.m_t[0] = extraout_XMM0_Qa_00;
    pdVar4 = ON_Interval::operator[](&local_70,1);
    dVar7 = *pdVar4;
    dVar6 = ON_Interval::operator[](domain,1);
    if (dVar7 < dVar6) {
      iVar3 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count;
      segment_index = iVar3 - 1;
      if (iVar3 < 1) {
        pOVar5 = (ON_Curve *)0x0;
      }
      else {
        pOVar5 = (this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_a[segment_index];
      }
      if (pOVar5 != (ON_Curve *)0x0) {
        local_70 = SegmentDomain(this,segment_index);
        dVar7 = local_70.m_t[1];
        (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
        local_40.m_t[1] = dVar7;
        dVar7 = ON_Interval::operator[](domain,1);
        dVar7 = ON_Interval::TransformParameterTo(&local_70,&local_40,dVar7);
        pdVar4 = ON_Interval::operator[](&local_40,0);
        ON_Interval::ON_Interval(&local_50,*pdVar4,dVar7);
        iVar3 = (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3d])
                          (pOVar5,&local_50);
        if ((char)iVar3 != '\0') {
          (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
          local_60.m_t[1] = dVar7;
          bVar2 = ON_Interval::operator==(&local_60,&local_50);
          if (bVar2) {
            dVar7 = ON_Interval::operator[](domain,1);
          }
          else {
            (*(pOVar5->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])(pOVar5);
            local_60.m_t[1] = dVar7;
            pdVar4 = ON_Interval::operator[](&local_60,1);
            dVar7 = ON_Interval::TransformParameterTo(&local_40,&local_70,*pdVar4);
          }
          (this->m_t).m_a[(this->m_segment).super_ON_SimpleArray<ON_Curve_*>.m_count] = dVar7;
          cVar1 = '\x01';
        }
      }
      if (pOVar5 == (ON_Curve *)0x0) goto LAB_005958e0;
    }
    if (cVar1 != '\0') {
      ON_Curve::DestroyCurveTree(&this->super_ON_Curve);
      cVar1 = '\x01';
    }
  }
  else {
LAB_005958e0:
    cVar1 = '\0';
  }
  return (bool)cVar1;
}

Assistant:

bool ON_PolyCurve::Extend(
  const ON_Interval& domain
  )
 
{
  if (IsClosed() || Count() < 1) return false;
 
  bool changed = false;
  if (Domain()[0] > domain[0]){
    ON_Curve* seg = SegmentCurve(0);
    if (!seg) return false;
    ON_Interval sdom = SegmentDomain(0);
    ON_Interval cdom = seg->Domain();
    double a = sdom.TransformParameterTo(cdom, domain[0]);
    ON_Interval DesiredDom(a, cdom[1]);
    changed = seg->Extend(DesiredDom);
    if (changed) {
      if (seg->Domain() == DesiredDom)
        m_t[0] = domain[0];
      else
        m_t[0] = cdom.TransformParameterTo(sdom, seg->Domain()[0]);
    }
  }
  if (Domain()[1] < domain[1]){
    bool chgd = false;
    ON_Curve* seg = SegmentCurve(Count()-1);
    if (!seg) return false;
    ON_Interval sdom = SegmentDomain(Count()-1);
    ON_Interval cdom = seg->Domain();
    double a = sdom.TransformParameterTo(cdom, domain[1]);
    ON_Interval DesiredDom(cdom[0], a);
    chgd = seg->Extend(DesiredDom);
    if (chgd) {
      if (seg->Domain() == DesiredDom)
        m_t[Count()] = domain[1];
      else
        m_t[Count()] = cdom.TransformParameterTo(sdom, seg->Domain()[1]);
      changed = true;
    }
  }
 
  if (changed){
    DestroyCurveTree();
  }
 
  return changed;
}